

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void minMaxValueFinalize(sqlite3_context *context,int bValue)

{
  Mem *pValue;
  sqlite3_value *pRes;
  int bValue_local;
  sqlite3_context *context_local;
  
  pValue = (Mem *)sqlite3_aggregate_context(context,0);
  if (pValue != (Mem *)0x0) {
    if (pValue->flags != 0) {
      sqlite3_result_value(context,pValue);
    }
    if (bValue == 0) {
      sqlite3VdbeMemRelease(pValue);
    }
  }
  return;
}

Assistant:

static void minMaxValueFinalize(sqlite3_context *context, int bValue){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    if( bValue==0 ) sqlite3VdbeMemRelease(pRes);
  }
}